

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O0

void __thiscall pstore::storage::update_master_pointers(storage *this,size_t old_length)

{
  memory_mapper_ptr *pmVar1;
  bool bVar2;
  size_type sVar3;
  element_type *peVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  pointer this_00;
  reference __a;
  type paVar7;
  iterator segment_end_00;
  memory_mapper_ptr *pmVar8;
  ulong uVar9;
  reference region_00;
  __normal_iterator<std::shared_ptr<pstore::memory_mapper_base>_*,_std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_>
  local_48;
  iterator region_end;
  iterator region_it;
  iterator segment_end;
  iterator segment_it;
  memory_mapper_ptr *region;
  uint64_t last_sat_entry;
  size_t old_length_local;
  storage *this_local;
  
  region = (memory_mapper_ptr *)0x0;
  last_sat_entry = old_length;
  old_length_local = (size_t)this;
  if (old_length != 0) {
    sVar3 = std::
            vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
            ::size(&this->regions_);
    if (sVar3 <= old_length) {
      assert_failed("old_length < regions_.size ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                    ,0x80);
    }
    segment_it = (iterator)
                 std::
                 vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                 ::operator[](&this->regions_,last_sat_entry - 1);
    peVar4 = std::
             __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)segment_it);
    uVar5 = memory_mapper_base::offset(peVar4);
    peVar4 = std::
             __shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)segment_it);
    uVar6 = memory_mapper_base::size(peVar4);
    region = (memory_mapper_ptr *)(uVar5 + uVar6 >> 0x16);
    this_00 = std::
              unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
              ::operator->(&this->sat_);
    __a = std::array<pstore::sat_entry,_65536UL>::at
                    (this_00,(size_type)
                             ((long)&region[-1].
                                     super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi + 7));
    bVar2 = std::operator!=(&__a->value,(nullptr_t)0x0);
    if (!bVar2) {
      assert_failed("sat_->at (last_sat_entry - 1).value != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                    ,0x83);
    }
  }
  paVar7 = std::
           unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           ::operator*(&this->sat_);
  segment_end = std::begin<std::array<pstore::sat_entry,65536ul>>(paVar7);
  paVar7 = std::
           unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
           ::operator*(&this->sat_);
  segment_end_00 = std::end<std::array<pstore::sat_entry,65536ul>>(paVar7);
  pmVar1 = region;
  pmVar8 = (memory_mapper_ptr *)std::numeric_limits<long>::max();
  if (pmVar8 < pmVar1) {
    assert_failed("last_sat_entry <= static_cast<std::make_unsigned<segment_difference_type>::type> ( std::numeric_limits<segment_difference_type>::max ())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                  ,0x8d);
  }
  std::advance<pstore::sat_entry*,long>(&segment_end,(long)region);
  region_end = std::
               begin<std::vector<std::shared_ptr<pstore::memory_mapper_base>,std::allocator<std::shared_ptr<pstore::memory_mapper_base>>>>
                         (&this->regions_);
  local_48._M_current =
       (shared_ptr<pstore::memory_mapper_base> *)
       std::
       end<std::vector<std::shared_ptr<pstore::memory_mapper_base>,std::allocator<std::shared_ptr<pstore::memory_mapper_base>>>>
                 (&this->regions_);
  uVar5 = last_sat_entry;
  uVar9 = std::numeric_limits<long>::max();
  if (uVar9 < uVar5) {
    assert_failed("old_length <= static_cast<std::make_unsigned<region_difference_type>::type> ( std::numeric_limits<region_difference_type>::max ())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                  ,0x95);
  }
  std::
  advance<__gnu_cxx::__normal_iterator<std::shared_ptr<pstore::memory_mapper_base>*,std::vector<std::shared_ptr<pstore::memory_mapper_base>,std::allocator<std::shared_ptr<pstore::memory_mapper_base>>>>,long>
            (&region_end,last_sat_entry);
  while (bVar2 = __gnu_cxx::operator!=(&region_end,&local_48), bVar2) {
    region_00 = __gnu_cxx::
                __normal_iterator<std::shared_ptr<pstore::memory_mapper_base>_*,_std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_>
                ::operator*(&region_end);
    segment_end = slice_region_into_segments(region_00,segment_end,segment_end_00);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pstore::memory_mapper_base>_*,_std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_>
    ::operator++(&region_end);
  }
  bVar2 = std::
          all_of<pstore::sat_entry*,pstore::storage::update_master_pointers(unsigned_long)::__0>
                    (segment_end,segment_end_00);
  if (bVar2) {
    return;
  }
  assert_failed("std::all_of (segment_it, segment_end, [] (sat_entry const & s) { return s.value == nullptr && s.region == nullptr; })"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/core/storage.cpp"
                ,0x9f);
}

Assistant:

void storage::update_master_pointers (std::size_t const old_length) {

        std::uint64_t last_sat_entry = 0;
        if (old_length > 0) {
            PSTORE_ASSERT (old_length < regions_.size ());
            region::memory_mapper_ptr const & region = regions_[old_length - 1];
            last_sat_entry = (region->offset () + region->size ()) / address::segment_size;
            PSTORE_ASSERT (sat_->at (last_sat_entry - 1).value != nullptr);
        }

        auto segment_it = std::begin (*sat_);
        auto const segment_end = std::end (*sat_);
        using segment_difference_type =
            std::iterator_traits<decltype (segment_it)>::difference_type;

        PSTORE_ASSERT (last_sat_entry <=
                       static_cast<std::make_unsigned<segment_difference_type>::type> (
                           std::numeric_limits<segment_difference_type>::max ()));
        std::advance (segment_it, static_cast<segment_difference_type> (last_sat_entry));

        auto region_it = std::begin (regions_);
        auto const region_end = std::end (regions_);

        using region_difference_type = std::iterator_traits<decltype (region_it)>::difference_type;
        PSTORE_ASSERT (old_length <= static_cast<std::make_unsigned<region_difference_type>::type> (
                                         std::numeric_limits<region_difference_type>::max ()));
        std::advance (region_it, static_cast<region_difference_type> (old_length));

        for (; region_it != region_end; ++region_it) {
            segment_it = storage::slice_region_into_segments (*region_it, segment_it, segment_end);
        }

        // Guarantee that segments beyond the mapped memory blocks are null.
        PSTORE_ASSERT (std::all_of (segment_it, segment_end, [] (sat_entry const & s) {
            return s.value == nullptr && s.region == nullptr;
        }));
    }